

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::texstorage2d(NegativeTestContext *ctx)

{
  deUint32 adVar1 [2];
  bool bVar2;
  ContextType ctxType;
  ApiType requiredApiType;
  RenderContext *pRVar3;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  GLuint local_18 [2];
  deUint32 textures [2];
  NegativeTestContext *ctx_local;
  
  local_18[0] = 0x1234;
  local_18[1] = 0x1234;
  textures = (deUint32  [2])ctx;
  glu::CallLogWrapper::glGenTextures(&ctx->super_CallLogWrapper,2,local_18);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)textures,0xde1,local_18[0]);
  NegativeTestContext::expectError((NegativeTestContext *)textures,0);
  adVar1 = textures;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "GL_INVALID_ENUM or GL_INVALID_VALUE is generated if internalformat is not a valid sized internal format."
             ,&local_39);
  NegativeTestContext::beginSection((NegativeTestContext *)adVar1,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  glu::CallLogWrapper::glTexStorage2D((CallLogWrapper *)textures,0xde1,1,0,0x10,0x10);
  NegativeTestContext::expectError((NegativeTestContext *)textures,0x500,0x501);
  glu::CallLogWrapper::glTexStorage2D((CallLogWrapper *)textures,0xde1,1,0x8d99,0x10,0x10);
  NegativeTestContext::expectError((NegativeTestContext *)textures,0x500,0x501);
  NegativeTestContext::endSection((NegativeTestContext *)textures);
  adVar1 = textures;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,
             "GL_INVALID_ENUM is generated if target is not one of the accepted target enumerants.",
             &local_71);
  NegativeTestContext::beginSection((NegativeTestContext *)adVar1,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  glu::CallLogWrapper::glTexStorage2D((CallLogWrapper *)textures,0,1,0x8058,0x10,0x10);
  NegativeTestContext::expectError((NegativeTestContext *)textures,0x500);
  glu::CallLogWrapper::glTexStorage2D((CallLogWrapper *)textures,0x806f,1,0x8058,0x10,0x10);
  NegativeTestContext::expectError((NegativeTestContext *)textures,0x500);
  glu::CallLogWrapper::glTexStorage2D((CallLogWrapper *)textures,0x8c1a,1,0x8058,0x10,0x10);
  NegativeTestContext::expectError((NegativeTestContext *)textures,0x500);
  NegativeTestContext::endSection((NegativeTestContext *)textures);
  adVar1 = textures;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"GL_INVALID_VALUE is generated if width or height are less than 1."
             ,&local_99);
  NegativeTestContext::beginSection((NegativeTestContext *)adVar1,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  glu::CallLogWrapper::glTexStorage2D((CallLogWrapper *)textures,0xde1,1,0x8058,0,0x10);
  NegativeTestContext::expectError((NegativeTestContext *)textures,0x501);
  glu::CallLogWrapper::glTexStorage2D((CallLogWrapper *)textures,0xde1,1,0x8058,0x10,0);
  NegativeTestContext::expectError((NegativeTestContext *)textures,0x501);
  glu::CallLogWrapper::glTexStorage2D((CallLogWrapper *)textures,0xde1,1,0x8058,0,0);
  NegativeTestContext::expectError((NegativeTestContext *)textures,0x501);
  pRVar3 = NegativeTestContext::getRenderContext((NegativeTestContext *)textures);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::es(3,2);
  bVar2 = glu::contextSupports(ctxType,requiredApiType);
  if (bVar2) {
    glu::CallLogWrapper::glBindTexture((CallLogWrapper *)textures,0x8513,local_18[1]);
    NegativeTestContext::expectError((NegativeTestContext *)textures,0);
    glu::CallLogWrapper::glTexStorage2D((CallLogWrapper *)textures,0x8513,1,0x8058,0,0x10);
    NegativeTestContext::expectError((NegativeTestContext *)textures,0x501);
    glu::CallLogWrapper::glTexStorage2D((CallLogWrapper *)textures,0x8513,1,0x8058,0x10,0);
    NegativeTestContext::expectError((NegativeTestContext *)textures,0x501);
    glu::CallLogWrapper::glTexStorage2D((CallLogWrapper *)textures,0x8513,1,0x8058,0,0);
    NegativeTestContext::expectError((NegativeTestContext *)textures,0x501);
  }
  NegativeTestContext::endSection((NegativeTestContext *)textures);
  glu::CallLogWrapper::glDeleteTextures((CallLogWrapper *)textures,2,local_18);
  return;
}

Assistant:

void texstorage2d (NegativeTestContext& ctx)
{
	deUint32  textures[] = {0x1234, 0x1234};

	ctx.glGenTextures(2, textures);
	ctx.glBindTexture(GL_TEXTURE_2D, textures[0]);
	ctx.expectError(GL_NO_ERROR);

	ctx.beginSection("GL_INVALID_ENUM or GL_INVALID_VALUE is generated if internalformat is not a valid sized internal format.");
	ctx.glTexStorage2D(GL_TEXTURE_2D, 1, 0, 16, 16);
	ctx.expectError(GL_INVALID_ENUM, GL_INVALID_VALUE);
	ctx.glTexStorage2D(GL_TEXTURE_2D, 1, GL_RGBA_INTEGER, 16, 16);
	ctx.expectError(GL_INVALID_ENUM, GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM is generated if target is not one of the accepted target enumerants.");
	ctx.glTexStorage2D(0, 1, GL_RGBA8, 16, 16);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexStorage2D(GL_TEXTURE_3D, 1, GL_RGBA8, 16, 16);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexStorage2D(GL_TEXTURE_2D_ARRAY, 1, GL_RGBA8, 16, 16);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if width or height are less than 1.");
	ctx.glTexStorage2D(GL_TEXTURE_2D, 1, GL_RGBA8, 0, 16);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexStorage2D(GL_TEXTURE_2D, 1, GL_RGBA8, 16, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexStorage2D(GL_TEXTURE_2D, 1, GL_RGBA8, 0, 0);
	ctx.expectError(GL_INVALID_VALUE);

	if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)))
	{
		ctx.glBindTexture(GL_TEXTURE_CUBE_MAP, textures[1]);
		ctx.expectError(GL_NO_ERROR);
		ctx.glTexStorage2D(GL_TEXTURE_CUBE_MAP, 1, GL_RGBA8, 0, 16);
		ctx.expectError(GL_INVALID_VALUE);
		ctx.glTexStorage2D(GL_TEXTURE_CUBE_MAP, 1, GL_RGBA8, 16, 0);
		ctx.expectError(GL_INVALID_VALUE);
		ctx.glTexStorage2D(GL_TEXTURE_CUBE_MAP, 1, GL_RGBA8, 0, 0);
		ctx.expectError(GL_INVALID_VALUE);
	}
	ctx.endSection();

	ctx.glDeleteTextures(2, textures);
}